

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

IfcFloat Assimp::IFC::ConvertSIPrefix(string *prefix)

{
  int iVar1;
  IfcFloat IVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)prefix);
  if (iVar1 == 0) {
    IVar2 = 9.999999843067494e+17;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prefix);
    if (iVar1 == 0) {
      IVar2 = 999999986991104.0;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)prefix);
      if (iVar1 == 0) {
        IVar2 = 999999995904.0;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)prefix);
        if (iVar1 == 0) {
          IVar2 = 1000000000.0;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)prefix);
          if (iVar1 == 0) {
            IVar2 = 1000000.0;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)prefix);
            if (iVar1 == 0) {
              IVar2 = 1000.0;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)prefix);
              if (iVar1 == 0) {
                IVar2 = 100.0;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)prefix);
                IVar2 = 1.0;
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)prefix);
                  if (iVar1 == 0) {
                    IVar2 = 0.10000000149011612;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)prefix);
                    if (iVar1 == 0) {
                      IVar2 = 0.009999999776482582;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)prefix);
                      if (iVar1 == 0) {
                        IVar2 = 0.0010000000474974513;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)prefix);
                        if (iVar1 == 0) {
                          IVar2 = 9.999999974752427e-07;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)prefix);
                          if (iVar1 == 0) {
                            IVar2 = 9.999999717180685e-10;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)prefix);
                            if (iVar1 == 0) {
                              IVar2 = 9.999999960041972e-13;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)prefix);
                              if (iVar1 == 0) {
                                IVar2 = 1.0000000036274937e-15;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)prefix);
                                if (iVar1 == 0) {
                                  IVar2 = 1.000000045813705e-18;
                                }
                                else {
                                  std::operator+(&local_1a8,"Unrecognized SI prefix: ",prefix);
                                  Formatter::
                                  basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  ::basic_formatter<std::__cxx11::string>
                                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                              *)local_188,&local_1a8);
                                  LogFunctions<Assimp::IFCImporter>::LogError((format *)local_188);
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_188);
                                  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                    operator_delete(local_1a8._M_dataplus._M_p);
                                  }
                                  IVar2 = 1.0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return IVar2;
}

Assistant:

IfcFloat ConvertSIPrefix(const std::string& prefix)
{
    if (prefix == "EXA") {
        return 1e18f;
    }
    else if (prefix == "PETA") {
        return 1e15f;
    }
    else if (prefix == "TERA") {
        return 1e12f;
    }
    else if (prefix == "GIGA") {
        return 1e9f;
    }
    else if (prefix == "MEGA") {
        return 1e6f;
    }
    else if (prefix == "KILO") {
        return 1e3f;
    }
    else if (prefix == "HECTO") {
        return 1e2f;
    }
    else if (prefix == "DECA") {
        return 1e-0f;
    }
    else if (prefix == "DECI") {
        return 1e-1f;
    }
    else if (prefix == "CENTI") {
        return 1e-2f;
    }
    else if (prefix == "MILLI") {
        return 1e-3f;
    }
    else if (prefix == "MICRO") {
        return 1e-6f;
    }
    else if (prefix == "NANO") {
        return 1e-9f;
    }
    else if (prefix == "PICO") {
        return 1e-12f;
    }
    else if (prefix == "FEMTO") {
        return 1e-15f;
    }
    else if (prefix == "ATTO") {
        return 1e-18f;
    }
    else {
        IFCImporter::LogError("Unrecognized SI prefix: " + prefix);
        return 1;
    }
}